

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scroll_widgets.cpp
# Opt level: O0

int h_scroll_layout_formula_proc(Am_Object *self)

{
  uint uVar1;
  bool bVar2;
  int value;
  int value_00;
  Am_Value *pAVar3;
  Am_Slot_Key key;
  int arrow_size;
  int border;
  Am_Widget_Look look;
  int height;
  int width;
  Am_Object indicator;
  Am_Object local_20;
  Am_Object arrow2;
  Am_Object arrow1;
  Am_Object *self_local;
  
  key = (Am_Slot_Key)self;
  Am_Object::Get_Object(&arrow2,key,0x1b5);
  Am_Object::Get_Object(&local_20,key,0x1b6);
  Am_Object::Get_Object((Am_Object *)&height,key,0x1b7);
  pAVar3 = Am_Object::Get(self,0x66,0);
  look.value = Am_Value::operator_cast_to_int(pAVar3);
  pAVar3 = Am_Object::Get(self,0x67,0);
  border = Am_Value::operator_cast_to_int(pAVar3);
  pAVar3 = Am_Object::Get(self,0x17f,0);
  Am_Widget_Look::Am_Widget_Look((Am_Widget_Look *)&arrow_size,pAVar3);
  bVar2 = Am_Widget_Look::operator==((Am_Widget_Look *)&arrow_size,&Am_MOTIF_LOOK);
  uVar1 = (uint)bVar2;
  value = uVar1 * 4;
  value_00 = border + uVar1 * -8;
  Am_Object::Set(&arrow2,100,value,0);
  Am_Object::Set(&arrow2,0x65,value,0);
  Am_Object::Set(&arrow2,0x66,value_00,0);
  Am_Object::Set(&arrow2,0x67,value_00,0);
  Am_Object::Set(&local_20,100,(look.value - value_00) + uVar1 * -4,0);
  Am_Object::Set(&local_20,0x65,value,0);
  Am_Object::Set(&local_20,0x66,value_00,0);
  Am_Object::Set(&local_20,0x67,value_00,0);
  bVar2 = Am_Widget_Look::operator==((Am_Widget_Look *)&arrow_size,&Am_MOTIF_LOOK);
  if (bVar2) {
    Am_Object::Set(self,0x1b2,value_00 + 1 + value,0);
    Am_Object::Set(self,0x1b4,look.value + value_00 * -2 + uVar1 * -8 + -2,0);
  }
  else {
    Am_Object::Set(self,0x1b2,value_00 + value,0);
    Am_Object::Set(self,0x1b4,look.value + value_00 * -2 + uVar1 * -8,0);
  }
  Am_Object::Set((Am_Object *)&height,0x65,value,0);
  Am_Object::Set((Am_Object *)&height,0x67,border + uVar1 * -8,0);
  Am_Object::~Am_Object((Am_Object *)&height);
  Am_Object::~Am_Object(&local_20);
  Am_Object::~Am_Object(&arrow2);
  return 0;
}

Assistant:

Am_Define_Formula(int, h_scroll_layout_formula)
{
  Am_Object arrow1 = self.Get_Object(Am_SCROLL_ARROW1);
  Am_Object arrow2 = self.Get_Object(Am_SCROLL_ARROW2);
  Am_Object indicator = self.Get_Object(Am_SCROLL_INDICATOR);
  int width = self.Get(Am_WIDTH);
  int height = self.Get(Am_HEIGHT);
  Am_Widget_Look look = self.Get(Am_WIDGET_LOOK);

  int border = (look == Am_MOTIF_LOOK) ? 4 : 0; // 2 for key sel and 2 for box
  int arrow_size = height - 2 * border;

  arrow1.Set(Am_LEFT, border);
  arrow1.Set(Am_TOP, border);
  arrow1.Set(Am_WIDTH, arrow_size);
  arrow1.Set(Am_HEIGHT, arrow_size); // square

  arrow2.Set(Am_LEFT, width - arrow_size - border); // minus size of arrows
  arrow2.Set(Am_TOP, border);
  arrow2.Set(Am_WIDTH, arrow_size);
  arrow2.Set(Am_HEIGHT, arrow_size); // square

  if (look == Am_MOTIF_LOOK) { //bottom of top arrow
    self.Set(Am_SCROLL_AREA_MIN, arrow_size + border + 1);
    self.Set(Am_SCROLL_AREA_SIZE, width - 2 * arrow_size - 2 * border - 2);
  } else {
    self.Set(Am_SCROLL_AREA_MIN, arrow_size + border); //bottom of top arrow
    self.Set(Am_SCROLL_AREA_SIZE, width - 2 * arrow_size - 2 * border);
  }

  indicator.Set(Am_TOP, border);
  indicator.Set(Am_HEIGHT, height - 2 * border);

  return 0; // return value not used
}